

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

void SN76489_ConnectT6W28(SN76489_Context *noisechip,SN76489_Context *tonechip)

{
  SN76489_Context *tonechip_local;
  SN76489_Context *noisechip_local;
  
  tonechip->NgpFlags = 0x80;
  tonechip->NgpChip2 = noisechip;
  noisechip->NgpFlags = 0x81;
  noisechip->NgpChip2 = tonechip;
  return;
}

Assistant:

static void SN76489_ConnectT6W28(SN76489_Context* noisechip, SN76489_Context* tonechip)
{
	// Activate special NeoGeoPocket Mode
	tonechip->NgpFlags = 0x80 | 0x00;
	tonechip->NgpChip2 = noisechip;
	noisechip->NgpFlags = 0x80 | 0x01;
	noisechip->NgpChip2 = tonechip;
	
	return;
}